

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryBuilder::readDataSegments(WasmBinaryBuilder *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  pointer pDVar4;
  mapped_type *this_00;
  Expression *pEVar5;
  const_iterator __first;
  const_iterator __last;
  __uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true> _Var6;
  Name memory;
  string_view sVar7;
  Name name;
  allocator_type local_109;
  vector<char,_std::allocator<char>_> local_108;
  undefined1 local_f0 [8];
  string_view data;
  Name *pNStack_d8;
  uint32_t size;
  key_type local_cc;
  undefined1 local_c8 [4];
  Index memIdx;
  string_view local_b8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  uint32_t local_54;
  uint32_t flags;
  Name local_48;
  Name local_38;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> local_28;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> curr;
  size_t i;
  uint32_t num;
  WasmBinaryBuilder *this_local;
  
  bVar1 = isDebugEnabled("binary");
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr,"== readDataSegments\n");
  }
  uVar2 = getU32LEB(this);
  curr._M_t.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
  super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
  super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true>)
       (__uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>)0x0;
  while( true ) {
    _Var6.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
    super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl._4_4_ = 0;
    _Var6.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
    super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
    super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl._0_4_ = uVar2;
    if ((ulong)_Var6.
               super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
               _M_t.
               super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
               super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl <=
        (ulong)curr._M_t.
               super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
               _M_t.
               super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
               super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl) {
      return;
    }
    wasm::Name::Name(&local_38,"");
    wasm::Name::Name(&local_48,"");
    wasm::Address::Address((Address *)&stack0xffffffffffffffb0,0);
    memory.super_IString.str._M_str = (char *)local_48.super_IString.str._M_len;
    memory.super_IString.str._M_len = (size_t)local_38.super_IString.str._M_str;
    name.super_IString.str._M_str = (char *)local_38.super_IString.str._M_len;
    name.super_IString.str._M_len = (size_t)&local_28;
    Builder::makeDataSegment
              (name,memory,SUB81(local_48.super_IString.str._M_str,0),(Expression *)0x0,(char *)0x0,
               (Address)0x218005f);
    local_54 = getU32LEB(this);
    if (2 < local_54) break;
    pDVar4 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                       (&local_28);
    sVar7 = (string_view)
            wasm::Name::fromInt((size_t)curr._M_t.
                                        super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                                        .super__Head_base<0UL,_wasm::DataSegment_*,_false>.
                                        _M_head_impl);
    local_b8 = sVar7;
    Named::setName(&pDVar4->super_Named,(Name)sVar7,false);
    uVar3 = local_54 & 1;
    pDVar4 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                       (&local_28);
    pDVar4->isPassive = uVar3 != 0;
    pDVar4 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                       (&local_28);
    if ((pDVar4->isPassive & 1U) == 0) {
      local_cc = 0;
      if ((local_54 & 2) != 0) {
        local_cc = getU32LEB(this);
      }
      this_00 = std::
                map<unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>_>_>_>
                ::operator[](&this->memoryRefs,&local_cc);
      pDVar4 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(&local_28);
      pNStack_d8 = &pDVar4->memory;
      std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>::push_back
                (this_00,&stack0xffffffffffffff28);
      pEVar5 = readExpression(this);
      pDVar4 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(&local_28);
      pDVar4->offset = pEVar5;
    }
    else {
      wasm::Name::Name((Name *)local_c8);
      pDVar4 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(&local_28);
      wasm::Name::operator=(&pDVar4->memory,(Name *)local_c8);
      pDVar4 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(&local_28);
      pDVar4->offset = (Expression *)0x0;
    }
    data._M_str._4_4_ = getU32LEB(this);
    sVar7 = getByteView(this,(ulong)data._M_str._4_4_);
    data._M_len = (size_t)sVar7._M_str;
    local_f0 = (undefined1  [8])sVar7._M_len;
    __first = std::basic_string_view<char,_std::char_traits<char>_>::begin
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_f0);
    __last = std::basic_string_view<char,_std::char_traits<char>_>::end
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_f0);
    std::allocator<char>::allocator();
    std::vector<char,std::allocator<char>>::vector<char_const*,void>
              ((vector<char,std::allocator<char>> *)&local_108,__first,__last,&local_109);
    pDVar4 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                       (&local_28);
    std::vector<char,_std::allocator<char>_>::operator=(&pDVar4->data,&local_108);
    std::vector<char,_std::allocator<char>_>::~vector(&local_108);
    std::allocator<char>::~allocator(&local_109);
    Module::addDataSegment(this->wasm,&local_28);
    std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::~unique_ptr
              (&local_28);
    curr._M_t.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t
    .super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
    super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true>)
         ((long)curr._M_t.
                super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                _M_t.
                super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 1);
  }
  std::__cxx11::to_string(&local_a8,local_54);
  std::operator+(&local_88,"bad segment flags, must be 0, 1, or 2, not ",&local_a8);
  throwError(this,&local_88);
}

Assistant:

void WasmBinaryBuilder::readDataSegments() {
  BYN_TRACE("== readDataSegments\n");
  auto num = getU32LEB();
  for (size_t i = 0; i < num; i++) {
    auto curr = Builder::makeDataSegment();
    uint32_t flags = getU32LEB();
    if (flags > 2) {
      throwError("bad segment flags, must be 0, 1, or 2, not " +
                 std::to_string(flags));
    }
    curr->setName(Name::fromInt(i), false);
    curr->isPassive = flags & BinaryConsts::IsPassive;
    if (curr->isPassive) {
      curr->memory = Name();
      curr->offset = nullptr;
    } else {
      Index memIdx = 0;
      if (flags & BinaryConsts::HasIndex) {
        memIdx = getU32LEB();
      }
      memoryRefs[memIdx].push_back(&curr->memory);
      curr->offset = readExpression();
    }
    auto size = getU32LEB();
    auto data = getByteView(size);
    curr->data = {data.begin(), data.end()};
    wasm.addDataSegment(std::move(curr));
  }
}